

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int archive_read_support_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  program_bidder *state_00;
  char *pcVar2;
  void *pvVar3;
  program_bidder *state;
  archive_read *a;
  size_t signature_len_local;
  void *signature_local;
  char *cmd_local;
  archive *_a_local;
  
  state_00 = (program_bidder *)calloc(1,0x28);
  if (state_00 != (program_bidder *)0x0) {
    pcVar2 = strdup(cmd);
    state_00->cmd = pcVar2;
    if (state_00->cmd != (char *)0x0) {
      if ((signature != (void *)0x0) && (signature_len != 0)) {
        state_00->signature_len = signature_len;
        pvVar3 = malloc(signature_len);
        state_00->signature = pvVar3;
        memcpy(state_00->signature,signature,signature_len);
      }
      iVar1 = __archive_read_register_bidder
                        ((archive_read *)_a,state_00,(char *)0x0,&program_bidder_vtable);
      if (iVar1 != 0) {
        free_state(state_00);
        return -0x1e;
      }
      return 0;
    }
  }
  free_state(state_00);
  archive_set_error(_a,0xc,"Can\'t allocate memory");
  return -0x1e;
}

Assistant:

int
archive_read_support_filter_program_signature(struct archive *_a,
    const char *cmd, const void *signature, size_t signature_len)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct program_bidder *state;

	/*
	 * Allocate our private state.
	 */
	state = (struct program_bidder *)calloc(1, sizeof (*state));
	if (state == NULL)
		goto memerr;
	state->cmd = strdup(cmd);
	if (state->cmd == NULL)
		goto memerr;

	if (signature != NULL && signature_len > 0) {
		state->signature_len = signature_len;
		state->signature = malloc(signature_len);
		memcpy(state->signature, signature, signature_len);
	}

	if (__archive_read_register_bidder(a, state, NULL,
				&program_bidder_vtable) != ARCHIVE_OK) {
		free_state(state);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);

memerr:
	free_state(state);
	archive_set_error(_a, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}